

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<char_const*,Double&,Double&,bool,ImVec4_const&,float>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul,5ul>
          (argument_loader<char_const*,Double&,Double&,bool,ImVec4_const&,float> *this,long call)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<type_caster<char,_void>,_type_caster<Double,_void>,_type_caster<Double,_void>,_type_caster<bool>,_type_caster<ImVec4,_void>,_type_caster<float,_void>_>_>
  *this_00;
  reference pvVar2;
  type_caster_generic *ptVar3;
  __tuple_element_t<3UL,_tuple<type_caster<char,_void>,_type_caster<Double,_void>,_type_caster<Double,_void>,_type_caster<bool>,_type_caster<ImVec4,_void>,_type_caster<float,_void>_>_>
  *this_01;
  __tuple_element_t<5UL,_tuple<type_caster<char,_void>,_type_caster<Double,_void>,_type_caster<Double,_void>,_type_caster<bool>,_type_caster<ImVec4,_void>,_type_caster<float,_void>_>_>
  *this_02;
  byte local_b1;
  reference local_b0;
  handle local_a0;
  reference local_98;
  handle local_88;
  reference local_80;
  handle local_70;
  reference local_68;
  handle local_58;
  reference local_50;
  handle local_40;
  reference local_38;
  handle local_28;
  long local_20;
  function_call *call_local;
  argument_loader<const_char_*,_Double_&,_Double_&,_bool,_const_ImVec4_&,_float> *this_local;
  
  local_20 = call;
  call_local = (function_call *)this;
  this_00 = std::
            get<0ul,pybind11::detail::type_caster<char,void>,pybind11::detail::type_caster<Double,void>,pybind11::detail::type_caster<Double,void>,pybind11::detail::type_caster<bool,void>,pybind11::detail::type_caster<ImVec4,void>,pybind11::detail::type_caster<float,void>>
                      ((tuple<pybind11::detail::type_caster<char,_void>,_pybind11::detail::type_caster<Double,_void>,_pybind11::detail::type_caster<Double,_void>,_pybind11::detail::type_caster<bool,_void>,_pybind11::detail::type_caster<ImVec4,_void>,_pybind11::detail::type_caster<float,_void>_>
                        *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_20 + 8),
                      0);
  local_28.m_ptr = pvVar2->m_ptr;
  local_38 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),0);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_38);
  bVar1 = type_caster<char,_void>::load(this_00,local_28,bVar1);
  local_b1 = 1;
  if (bVar1) {
    ptVar3 = (type_caster_generic *)
             std::
             get<1ul,pybind11::detail::type_caster<char,void>,pybind11::detail::type_caster<Double,void>,pybind11::detail::type_caster<Double,void>,pybind11::detail::type_caster<bool,void>,pybind11::detail::type_caster<ImVec4,void>,pybind11::detail::type_caster<float,void>>
                       ((tuple<pybind11::detail::type_caster<char,_void>,_pybind11::detail::type_caster<Double,_void>,_pybind11::detail::type_caster<Double,_void>,_pybind11::detail::type_caster<bool,_void>,_pybind11::detail::type_caster<ImVec4,_void>,_pybind11::detail::type_caster<float,_void>_>
                         *)this);
    pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                       ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                        (local_20 + 8),1);
    local_40.m_ptr = pvVar2->m_ptr;
    local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),1);
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_50);
    bVar1 = type_caster_generic::load(ptVar3,local_40,bVar1);
    local_b1 = 1;
    if (bVar1) {
      ptVar3 = (type_caster_generic *)
               std::
               get<2ul,pybind11::detail::type_caster<char,void>,pybind11::detail::type_caster<Double,void>,pybind11::detail::type_caster<Double,void>,pybind11::detail::type_caster<bool,void>,pybind11::detail::type_caster<ImVec4,void>,pybind11::detail::type_caster<float,void>>
                         ((tuple<pybind11::detail::type_caster<char,_void>,_pybind11::detail::type_caster<Double,_void>,_pybind11::detail::type_caster<Double,_void>,_pybind11::detail::type_caster<bool,_void>,_pybind11::detail::type_caster<ImVec4,_void>,_pybind11::detail::type_caster<float,_void>_>
                           *)this);
      pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                         ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                          (local_20 + 8),2);
      local_58.m_ptr = pvVar2->m_ptr;
      local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),2);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_68);
      bVar1 = type_caster_generic::load(ptVar3,local_58,bVar1);
      local_b1 = 1;
      if (bVar1) {
        this_01 = std::
                  get<3ul,pybind11::detail::type_caster<char,void>,pybind11::detail::type_caster<Double,void>,pybind11::detail::type_caster<Double,void>,pybind11::detail::type_caster<bool,void>,pybind11::detail::type_caster<ImVec4,void>,pybind11::detail::type_caster<float,void>>
                            ((tuple<pybind11::detail::type_caster<char,_void>,_pybind11::detail::type_caster<Double,_void>,_pybind11::detail::type_caster<Double,_void>,_pybind11::detail::type_caster<bool,_void>,_pybind11::detail::type_caster<ImVec4,_void>,_pybind11::detail::type_caster<float,_void>_>
                              *)this);
        pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                           ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                            (local_20 + 8),3);
        local_70.m_ptr = pvVar2->m_ptr;
        local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),3);
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_80);
        bVar1 = type_caster<bool,_void>::load(this_01,local_70,bVar1);
        local_b1 = 1;
        if (bVar1) {
          ptVar3 = (type_caster_generic *)
                   std::
                   get<4ul,pybind11::detail::type_caster<char,void>,pybind11::detail::type_caster<Double,void>,pybind11::detail::type_caster<Double,void>,pybind11::detail::type_caster<bool,void>,pybind11::detail::type_caster<ImVec4,void>,pybind11::detail::type_caster<float,void>>
                             ((tuple<pybind11::detail::type_caster<char,_void>,_pybind11::detail::type_caster<Double,_void>,_pybind11::detail::type_caster<Double,_void>,_pybind11::detail::type_caster<bool,_void>,_pybind11::detail::type_caster<ImVec4,_void>,_pybind11::detail::type_caster<float,_void>_>
                               *)this);
          pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                             ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                              (local_20 + 8),4);
          local_88.m_ptr = pvVar2->m_ptr;
          local_98 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),4);
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_98);
          bVar1 = type_caster_generic::load(ptVar3,local_88,bVar1);
          local_b1 = 1;
          if (bVar1) {
            this_02 = std::
                      get<5ul,pybind11::detail::type_caster<char,void>,pybind11::detail::type_caster<Double,void>,pybind11::detail::type_caster<Double,void>,pybind11::detail::type_caster<bool,void>,pybind11::detail::type_caster<ImVec4,void>,pybind11::detail::type_caster<float,void>>
                                ((tuple<pybind11::detail::type_caster<char,_void>,_pybind11::detail::type_caster<Double,_void>,_pybind11::detail::type_caster<Double,_void>,_pybind11::detail::type_caster<bool,_void>,_pybind11::detail::type_caster<ImVec4,_void>,_pybind11::detail::type_caster<float,_void>_>
                                  *)this);
            pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                               ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                                (local_20 + 8),5);
            local_a0.m_ptr = pvVar2->m_ptr;
            local_b0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),5);
            bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_b0);
            bVar1 = type_caster<float,_void>::load(this_02,local_a0,bVar1);
            local_b1 = bVar1 ^ 0xff;
          }
        }
      }
    }
  }
  return (local_b1 & 1) == 0;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }